

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O3

bool __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
isCompleted(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,int index)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->promiseLock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  p_Var3 = (this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var5->_M_header;
  p_Var4 = &p_Var5->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (index <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < index];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var5) && (p_Var4 = p_Var2, index < (int)p_Var2[1]._M_color))
    {
      p_Var4 = &p_Var5->_M_header;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
  return (_Rb_tree_header *)p_Var4 != p_Var5;
}

Assistant:

bool isCompleted(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = usedPromiseByInteger.find(index);
        return (fnd != usedPromiseByInteger.end());
    }